

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

bool __thiscall EthBasePort::WriteBroadcastReadRequest(EthBasePort *this,uint seq)

{
  int iVar1;
  ostream *poVar2;
  
  if (this->useFwBridge == false) {
    iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x2f])(this);
    if (0 < iVar1) {
      poVar2 = (this->super_BasePort).outStr;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"WriteBroadcastReadRequest: flushed ",0x23);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," packets",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", seq = ",8);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x24])
                    (this,0x3f,0x1800,(ulong)(seq << 0x10 | (this->super_BasePort).BoardInUseMask_))
  ;
  return SUB41(iVar1,0);
}

Assistant:

bool EthBasePort::WriteBroadcastReadRequest(unsigned int seq)
{
    if (!useFwBridge) {
        // Ethernet-only system automatically sends a response packet in response to
        // the broadcast read request, so we first flush any existing packets.
        // When using the Ethernet/Firewire bridge, the flush happens in ReadBlockNode,
        // which is called by BasePort::ReceiveBroadcastReadResponse.
        int numFlushed = PacketFlushAll();
        if (numFlushed > 0)
            outStr << "WriteBroadcastReadRequest: flushed " << numFlushed << " packets"
                   << ", seq = " << seq << std::endl;
    }
    quadlet_t bcReqData = (seq << 16) | BoardInUseMask_;
    return WriteQuadlet(FW_NODE_BROADCAST, 0x1800, bcReqData);
}